

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O0

void __thiscall VM_Writer::write_pop(VM_Writer *this,string *segment,int index)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int index_local;
  string *segment_local;
  VM_Writer *this_local;
  
  poVar1 = (ostream *)this->out_file;
  local_1c = index;
  psStack_18 = segment;
  segment_local = (string *)this;
  std::operator+(&local_60,"pop ",segment);
  std::operator+(&local_40,&local_60," ");
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void VM_Writer::write_pop(const std::string &segment, int index) {
    out_file << "pop " + segment + " " << index << std::endl;
}